

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
HasProperty_Internal<false>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance,PropertyId propertyId,bool *noRedecl,PropertyValueInfo *info,
          bool *pDeclaredProperty,bool *pNonconfigurableProperty)

{
  byte bVar1;
  unsigned_short uVar2;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  uint32 index;
  Entry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
  *pEVar6;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  
  if (propertyId == -1) {
    return 0;
  }
  propertyRecord = (PropertyRecord *)info;
  local_40 = ScriptContext::GetPropertyName
                       ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  this_00 = (this->propertyMap).ptr;
  uVar4 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,&local_40);
  if ((int)uVar4 < 0) {
    bVar3 = DynamicObject::HasObjectArray(instance);
    BVar5 = 0;
    if ((bVar3) && (local_40->isNumeric == true)) {
      index = PropertyRecord::GetNumericValue(local_40);
      BVar5 = DynamicTypeHandler::HasItem(&this->super_DynamicTypeHandler,instance,index);
    }
  }
  else {
    pEVar6 = (this_00->entries).ptr + uVar4;
    bVar1 = *(PropertyAttributes *)
             ((long)&(pEVar6->
                     super_DictionaryEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                     ).
                     super_CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     .
                     super_KeyValueEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                     .
                     super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>_>
                     .
                     super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                     .value + 1);
    BVar5 = 0;
    if ((bVar1 & 0x18) == 0) {
      if ((noRedecl != (bool *)0x0) && (0x3f < bVar1)) {
        *noRedecl = true;
      }
      if ((pDeclaredProperty != (bool *)0x0) && (0x1f < bVar1)) {
        *pDeclaredProperty = true;
      }
      if ((pNonconfigurableProperty != (bool *)0x0) && ((bVar1 & 2) == 0)) {
        *pNonconfigurableProperty = true;
      }
      BVar5 = 1;
      if ((propertyRecord != (PropertyRecord *)0x0) &&
         (uVar2 = *(unsigned_short *)
                   ((long)&(pEVar6->
                           super_DictionaryEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                           ).
                           super_CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                           .
                           super_KeyValueEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                           .
                           super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>_>
                           .
                           super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                           .value + 2), uVar2 != 0xffff)) {
        (propertyRecord->super_FinalizableObject).super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject = (_func_int **)instance;
        *(unsigned_short *)&propertyRecord->pid = uVar2;
        *(byte *)((long)&propertyRecord->pid + 2) = bVar1;
        *(undefined1 *)((long)&propertyRecord->pid + 3) = 0;
        if ((*(byte *)&(pEVar6->
                       super_DictionaryEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                       ).
                       super_CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .
                       super_KeyValueEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                       .
                       super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>_>
                       .
                       super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                       .value & 6) != 2) {
          *(byte *)&propertyRecord->hash = (byte)propertyRecord->hash & 0xfb;
        }
      }
    }
  }
  return BVar5;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::HasProperty_Internal(DynamicObject* instance, PropertyId propertyId, bool *noRedecl, _Inout_opt_ PropertyValueInfo* info, bool *pDeclaredProperty, bool *pNonconfigurableProperty)
    {
        // HasProperty is called with NoProperty in JavascriptDispatch.cpp to for undeferral of the
        // deferred type system that DOM objects use.  Allow NoProperty for this reason, but only
        // here in HasProperty.
        if (propertyId == Constants::NoProperty)
        {
            return false;
        }

        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if ((descriptor->Attributes & PropertyDeleted) || (!allowLetConstGlobal && !descriptor->HasNonLetConstGlobal()))
            {
                return false;
            }
            if (noRedecl && descriptor->Attributes & PropertyNoRedecl)
            {
                *noRedecl = true;
            }
            if (pDeclaredProperty && descriptor->Attributes & (PropertyNoRedecl | PropertyDeclaredGlobal))
            {
                *pDeclaredProperty = true;
            }
            if (pNonconfigurableProperty && !(descriptor->Attributes & PropertyConfigurable))
            {
                *pNonconfigurableProperty = true;
            }
            if (info && descriptor->propertyIndex != NoSlots)
            {
                SetPropertyValueInfo(info, instance, descriptor);
            }
            return true;
        }

        // Check numeric propertyRecord only if objectArray available
        if (instance->HasObjectArray() && propertyRecord->IsNumeric())
        {
            return SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::HasItem(instance, propertyRecord->GetNumericValue());
        }

        return false;
    }